

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          Object<cmCMakePresetsGraph::ConfigurePreset> *func,bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  _Any_data local_40;
  _Manager_type local_30;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>&,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*)>
              *)local_40._M_pod_data,func);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_40,required);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }